

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

string * cs_impl::string_cs_ext::cut(string *__return_storage_ptr__,string *str,numeric *n)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    uVar1 = (ulong)ROUND(*(longdouble *)&n->data);
    if (n->type != false) {
      uVar1 = (n->data)._int;
    }
    if (uVar1 <= uVar2) break;
    std::__cxx11::string::pop_back();
    uVar2 = uVar2 + 1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

string cut(string &str, const numeric& n)
		{
			for (std::size_t i = 0; i < n.as_integer(); ++i)
				str.pop_back();
			return str;
		}